

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocaleData::unsLongLongToString
          (QString *__return_storage_ptr__,QLocaleData *this,qulonglong l,int precision,int base,
          int width,uint flags)

{
  byte bVar1;
  char16_t *pcVar2;
  long in_FS_OFFSET;
  QStringView zero;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->m_zero_size;
  pcVar2 = L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
           + this->m_zero_idx;
  if ((ulong)bVar1 == 0) {
    pcVar2 = (char16_t *)0x0;
  }
  if (l == 0) {
    local_50.d.size = 1;
    if (base == 10) {
      local_50.d.size = (ulong)bVar1;
    }
    local_50.d.ptr = L"0";
    if (base == 10) {
      local_50.d.ptr = pcVar2;
    }
    local_50.d.d = (Data *)0x0;
  }
  else {
    zero.m_size._0_1_ = bVar1;
    zero.m_data = pcVar2;
    zero.m_size._1_7_ = 0;
    qulltoa(&local_50,l,base,zero);
  }
  applyIntegerFormatting(__return_storage_ptr__,this,&local_50,false,precision,base,width,flags);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocaleData::unsLongLongToString(qulonglong l, int precision,
                                         int base, int width, unsigned flags) const
{
    const QString zero = zeroDigit();
    QString resultZero = base == 10 ? zero : QStringLiteral("0");
    return applyIntegerFormatting(l ? qulltoa(l, base, zero) : resultZero,
                                  false, precision, base, width, flags);
}